

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O0

void __thiscall ByteArray::grow(ByteArray *this,size_t neededSize)

{
  byte *pbVar1;
  size_t neededSize_local;
  ByteArray *this_local;
  
  if (this->allocatedSize_ <= neededSize) {
    this->allocatedSize_ = neededSize + 0x1ff & 0xfffffffffffffe00;
    if (this->data_ == (byte *)0x0) {
      pbVar1 = (byte *)malloc(this->allocatedSize_);
      this->data_ = pbVar1;
    }
    else {
      pbVar1 = (byte *)realloc(this->data_,this->allocatedSize_);
      this->data_ = pbVar1;
    }
  }
  return;
}

Assistant:

void ByteArray::grow(size_t neededSize)
{
	if (neededSize < allocatedSize_) return;

	// align to next 0.5kb... it's a start
	allocatedSize_ = ((neededSize+511)/512)*512;
	if (data_ == nullptr)
	{
		data_ = (byte*) malloc(allocatedSize_);
	} else {
		data_ = (byte*) realloc(data_,allocatedSize_);
	}
}